

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall
chatra::ValueWriterForDebugger::addValue(ValueWriterForDebugger *this,string *key,Value *v)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_00;
  size_type *psVar1;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::debugger::Value>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var2;
  bool bVar3;
  char cVar4;
  char cVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  undefined8 *puVar8;
  long *plVar9;
  anon_union_8_4_0d4e567c_for_Value_1 *paVar10;
  uint uVar11;
  pointer pcVar12;
  uint __val;
  undefined1 local_130 [8];
  mapped_type vFirst;
  pointer *local_98;
  uint local_90;
  undefined4 uStack_8c;
  pointer local_88 [2];
  size_type *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  size_type *psStack_50;
  uint count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int iVar13;
  
  this_00 = &this->keys;
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,key);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_130._0_4_ = Bool;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string&,int>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,key);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::debugger::Value>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string,chatra::debugger::Value>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::debugger::Value>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this->values,key,v);
    return;
  }
  iVar13 = *(int *)((long)iVar6.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                          ._M_cur + 0x28);
  vFirst.methodArgs.field_2._8_8_ = v;
  if (iVar13 == 1) {
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this->values,key);
    debugger::Value::Value((Value *)local_130,pmVar7);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chatra::debugger::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&this->values->_M_h,key);
    p_Var2 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::debugger::Value>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this->values;
    psStack_50 = &__str._M_string_length;
    pcVar12 = (key->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffffb0,pcVar12,pcVar12 + key->_M_string_length);
    std::__cxx11::string::append((char *)&stack0xffffffffffffffb0);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::debugger::Value>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string,chatra::debugger::Value>
              (p_Var2,&stack0xffffffffffffffb0,local_130);
    if (psStack_50 != &__str._M_string_length) {
      operator_delete(psStack_50);
    }
    if ((size_type *)vFirst.methodName.field_2._8_8_ != &vFirst.methodArgs._M_string_length) {
      operator_delete((void *)vFirst.methodName.field_2._8_8_);
    }
    if ((size_type *)vFirst.className.field_2._8_8_ != &vFirst.methodName._M_string_length) {
      operator_delete((void *)vFirst.className.field_2._8_8_);
    }
    if ((size_type *)vFirst.vString.field_2._8_8_ != &vFirst.className._M_string_length) {
      operator_delete((void *)vFirst.vString.field_2._8_8_);
    }
    if (vFirst.field_1 != &vFirst.vString._M_string_length) {
      operator_delete((void *)vFirst.field_1);
    }
    iVar13 = *(int *)((long)iVar6.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                            ._M_cur + 0x28);
  }
  __val = iVar13 + 1;
  p_Var2 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::debugger::Value>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            *)this->values;
  local_78 = &__str_1._M_string_length;
  pcVar12 = (key->_M_dataplus)._M_p;
  __str_1.field_2._12_4_ = __val;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar12,pcVar12 + key->_M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  cVar5 = '\x01';
  if (9 < __val) {
    uVar11 = __val;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar11 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0013e297;
      }
      if (uVar11 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0013e297;
      }
      if (uVar11 < 10000) goto LAB_0013e297;
      bVar3 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_0013e297:
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,local_90,__val);
  pcVar12 = (pointer)0xf;
  if (local_78 != &__str_1._M_string_length) {
    pcVar12 = (pointer)__str_1._M_string_length;
  }
  if (pcVar12 < __str_1._M_dataplus._M_p + CONCAT44(uStack_8c,local_90)) {
    pcVar12 = (pointer)0xf;
    if (local_98 != local_88) {
      pcVar12 = local_88[0];
    }
    if (__str_1._M_dataplus._M_p + CONCAT44(uStack_8c,local_90) <= pcVar12) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
      goto LAB_0013e323;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
LAB_0013e323:
  psStack_50 = &__str._M_string_length;
  psVar1 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar1) {
    __str._M_string_length = *psVar1;
    __str.field_2._M_allocated_capacity = puVar8[3];
  }
  else {
    __str._M_string_length = *psVar1;
    psStack_50 = (size_type *)*puVar8;
  }
  __str._M_dataplus._M_p = (pointer)puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffffb0);
  paVar10 = (anon_union_8_4_0d4e567c_for_Value_1 *)(plVar9 + 2);
  if ((anon_union_8_4_0d4e567c_for_Value_1 *)*plVar9 == paVar10) {
    vFirst.field_1 = *paVar10;
    vFirst.vString._M_dataplus._M_p._0_4_ = (undefined4)plVar9[3];
    vFirst.vString._M_dataplus._M_p._4_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
    local_130 = (undefined1  [8])&vFirst.field_1;
  }
  else {
    vFirst.field_1 = *paVar10;
    local_130 = (undefined1  [8])*plVar9;
  }
  vFirst._0_8_ = plVar9[1];
  *plVar9 = (long)paVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,chatra::debugger::Value>,std::allocator<std::pair<std::__cxx11::string_const,chatra::debugger::Value>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string,chatra::debugger::Value>
            (p_Var2,local_130,vFirst.methodArgs.field_2._8_8_);
  if (local_130 != (undefined1  [8])&vFirst.field_1) {
    operator_delete((void *)local_130);
  }
  if (psStack_50 != &__str._M_string_length) {
    operator_delete(psStack_50);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_78 != &__str_1._M_string_length) {
    operator_delete(local_78);
  }
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string,unsigned_int&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this_00,key,(undefined1 *)((long)&__str_1.field_2 + 0xc));
  return;
}

Assistant:

void addValue(std::string key, debugger::Value v) {
		auto it = keys.find(key);
		if (it == keys.cend()) {
			keys.emplace(key, 1);
			values.emplace(std::move(key), std::move(v));
			return;
		}

		if (it->second == 1) {
			auto vFirst = values[key];
			values.erase(key);
			values.emplace(key + "[1]", std::move(vFirst));
		}

		auto count = it->second + 1;
		values.emplace(key + "[" + std::to_string(count) + "]", std::move(v));
		keys.emplace(std::move(key), count);
	}